

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_tree.cpp
# Opt level: O2

TreeNode * si9ma::BinaryTree::get_pre(TreeNode *head)

{
  TreeNode *pTVar1;
  bool bVar2;
  
  if (head == (TreeNode *)0x0) {
LAB_00108d2a:
    pTVar1 = (TreeNode *)0x0;
  }
  else {
    if (head->left != (TreeNode *)0x0) {
      pTVar1 = get_right_most(head->left);
      return pTVar1;
    }
    do {
      pTVar1 = head->parent;
      if (pTVar1 == (TreeNode *)0x0) goto LAB_00108d2a;
      bVar2 = pTVar1->right != head;
      head = pTVar1;
    } while (bVar2);
  }
  return pTVar1;
}

Assistant:

const TreeNode* BinaryTree::get_pre(const TreeNode *head) {
        if (head == nullptr)
            return head;

        if (head->left != nullptr)
            return get_right_most(head->left);
        else{
            auto *cur = head;
            auto *parent = head->parent;

            while (parent != nullptr && parent->right != cur){
                cur = parent;
                parent = parent->parent;
            }

            return parent;
        }
    }